

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::PolyKernel::MergePartialFromCodedStream
          (PolyKernel *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  double *pdVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  double in_RAX;
  char cVar7;
  ulong uVar8;
  double dVar9;
  double local_28;
  
  local_28 = in_RAX;
LAB_0013cca1:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013ccc4;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013ccc4:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) != 0) {
      uVar6 = (uint)(uVar8 >> 3) & 0x1fffffff;
      cVar7 = (char)uVar8;
      if (uVar6 == 3) {
        if (cVar7 == '\x19') {
          pdVar3 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
            bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                              (input,(uint64 *)&local_28);
            dVar9 = local_28;
            if (!bVar4) {
              return false;
            }
          }
          else {
            dVar9 = *pdVar3;
            input->buffer_ = (uint8 *)(pdVar3 + 1);
          }
          this->gamma_ = dVar9;
          goto LAB_0013cca1;
        }
      }
      else if (uVar6 == 2) {
        if (cVar7 == '\x11') {
          pdVar3 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
            bVar4 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                              (input,(uint64 *)&local_28);
            dVar9 = local_28;
            if (!bVar4) {
              return false;
            }
          }
          else {
            dVar9 = *pdVar3;
            input->buffer_ = (uint8 *)(pdVar3 + 1);
          }
          this->c_ = dVar9;
          goto LAB_0013cca1;
        }
      }
      else if ((uVar6 == 1) && (cVar7 == '\b')) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar8 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0013cdcf;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_0013cdcf:
          uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar8 < 0) {
            return false;
          }
        }
        this->degree_ = (int32)uVar8;
        goto LAB_0013cca1;
      }
    }
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool PolyKernel::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.PolyKernel)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 degree = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &degree_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double c = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(17u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &c_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double gamma = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(25u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &gamma_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.PolyKernel)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.PolyKernel)
  return false;
#undef DO_
}